

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall QTreeViewPrivate::initialize(QTreeViewPrivate *this)

{
  QWidget *this_00;
  void **ppvVar1;
  void *pvVar2;
  int iVar3;
  QStyle *pQVar4;
  QHeaderView *this_01;
  undefined4 *puVar5;
  QTreeView *q;
  long in_FS_OFFSET;
  void *local_60;
  code *local_58;
  ImplFn local_50;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  pQVar4 = QWidget::style(this_00);
  iVar3 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x58,0,this_00);
  this->indent = iVar3;
  QFramePrivate::updateStyledFrameWidths((QFramePrivate *)this);
  QAbstractItemView::setSelectionBehavior((QAbstractItemView *)this_00,SelectRows);
  QAbstractItemView::setSelectionMode((QAbstractItemView *)this_00,SingleSelection);
  QAbstractItemView::setHorizontalScrollMode((QAbstractItemView *)this_00,ScrollPerPixel);
  QWidget::setAttribute(this_00,WA_MacShowFocusRect,true);
  this_01 = (QHeaderView *)operator_new(0x28);
  QHeaderView::QHeaderView(this_01,Horizontal,this_00);
  QHeaderView::setSectionsMovable(this_01,true);
  QHeaderView::setStretchLastSection(this_01,true);
  QHeaderView::setDefaultAlignment(this_01,(Alignment)0x81);
  QTreeView::setHeader((QTreeView *)this_00,this_01);
  pQVar4 = QWidget::style(this_00);
  iVar3 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x71,0,this_00,0);
  this->animationsEnabled = 0 < iVar3;
  local_48 = QAbstractAnimation::finished;
  local_40 = 0;
  local_58 = endAnimatedOperation;
  local_50 = (ImplFn)0x0;
  ppvVar1 = *(void ***)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  puVar5 = (undefined4 *)operator_new(0x20);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::QPrivateSlotObject<void_(QTreeViewPrivate::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar5 + 4) = endAnimatedOperation;
  *(undefined8 *)(puVar5 + 6) = 0;
  QObject::connectImpl
            ((QObject *)&local_60,(void **)&this->animatedOperation,(QObject *)&local_48,ppvVar1,
             (QSlotObjectBase *)&local_58,(ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  pvVar2 = (this->animationConnection).d_ptr;
  (this->animationConnection).d_ptr = local_60;
  local_60 = pvVar2;
  QMetaObject::Connection::~Connection((Connection *)&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeViewPrivate::initialize()
{
    Q_Q(QTreeView);

    updateIndentationFromStyle();
    updateStyledFrameWidths();
    q->setSelectionBehavior(QAbstractItemView::SelectRows);
    q->setSelectionMode(QAbstractItemView::SingleSelection);
    q->setHorizontalScrollMode(QAbstractItemView::ScrollPerPixel);
    q->setAttribute(Qt::WA_MacShowFocusRect);

    QHeaderView *header = new QHeaderView(Qt::Horizontal, q);
    header->setSectionsMovable(true);
    header->setStretchLastSection(true);
    header->setDefaultAlignment(Qt::AlignLeft|Qt::AlignVCenter);
    q->setHeader(header);
#if QT_CONFIG(animation)
    animationsEnabled = q->style()->styleHint(QStyle::SH_Widget_Animation_Duration, nullptr, q) > 0;
    animationConnection =
        QObjectPrivate::connect(&animatedOperation, &QVariantAnimation::finished,
                                this, &QTreeViewPrivate::endAnimatedOperation);
#endif // animation
}